

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::AddSlotArrayCheck(Lowerer *this,PropertySym *propertySym,Instr *instr)

{
  OpCode OVar1;
  uint uVar2;
  Instr *this_00;
  Instr *this_01;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  uint32 uVar4;
  uint uVar5;
  IntConstOpnd *pIVar6;
  Opnd *this_02;
  RegOpnd *pRVar7;
  Instr *this_03;
  
  if (propertySym->m_stackSym != this->m_func->m_localClosureSym) goto LAB_0055b129;
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,ClosureRangeCheckPhase,sourceContextId,functionId);
  if (bVar3) goto LAB_0055b129;
  this_00 = (propertySym->m_stackSym->field_5).m_instrDef;
  bVar3 = Func::IsLoopBody(this->m_func);
  if (this_00 == (Instr *)0x0) goto LAB_0055b129;
  uVar2 = propertySym->m_propertyId;
  OVar1 = this_00->m_opcode;
  if (OVar1 - 0x21c < 2) {
LAB_0055b045:
    pIVar6 = IR::Opnd::AsIntConstOpnd(this_00->m_src1);
    uVar4 = IR::IntConstOpnd::AsUint32(pIVar6);
    if (uVar4 <= uVar2) {
LAB_0055b060:
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
  }
  else {
    if (OVar1 != LdSlot) {
      if (OVar1 == ArgIn_A) goto LAB_0055b129;
      if (OVar1 != LdSlotArr) {
        if (OVar1 == SlotArrayCheck) {
          pIVar6 = IR::Opnd::AsIntConstOpnd(this_00->m_src2);
          uVar5 = IR::IntConstOpnd::AsInt32(pIVar6);
          if (uVar5 < uVar2) {
            pIVar6 = IR::IntConstOpnd::New((ulong)uVar2,TyUint32,this->m_func,false);
            IR::Instr::ReplaceSrc2(this_00,&pIVar6->super_Opnd);
          }
          goto LAB_0055b129;
        }
        if (OVar1 != NewScopeSlotsWithoutPropIds) goto LAB_0055b060;
        goto LAB_0055b045;
      }
    }
    if (bVar3 && 2 < uVar2) {
      this_01 = this_00->m_next;
      this_02 = IR::Instr::UnlinkDst(this_00);
      pRVar7 = IR::Opnd::AsRegOpnd(this_02);
      this_03 = IR::Instr::New(SlotArrayCheck,&pRVar7->super_Opnd,this->m_func);
      pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
      IR::Instr::SetDst(this_00,&pRVar7->super_Opnd);
      IR::Instr::SetSrc1(this_03,&pRVar7->super_Opnd);
      pIVar6 = IR::IntConstOpnd::New((ulong)uVar2,TyUint32,this->m_func,false);
      IR::Instr::SetSrc2(this_03,&pIVar6->super_Opnd);
      IR::Instr::InsertBefore(this_01,this_03);
    }
  }
LAB_0055b129:
  return instr->m_prev;
}

Assistant:

IR::Instr* Lowerer::AddSlotArrayCheck(PropertySym *propertySym, IR::Instr* instr)
{
    if (propertySym->m_stackSym != m_func->GetLocalClosureSym() || PHASE_OFF(Js::ClosureRangeCheckPhase, m_func))
    {
        return instr->m_prev;
    }

    IR::Instr *instrDef = propertySym->m_stackSym->m_instrDef;

    bool doDynamicCheck = this->m_func->IsLoopBody();
    bool insertSlotArrayCheck = false;
    uint32 slotId = (uint32)propertySym->m_propertyId;

    if (instrDef)
    {
        switch (instrDef->m_opcode)
        {
        case Js::OpCode::NewScopeSlots:
        case Js::OpCode::NewStackScopeSlots:
        case Js::OpCode::NewScopeSlotsWithoutPropIds:
        {
            IR::Opnd *allocOpnd = allocOpnd = instrDef->GetSrc1();
            uint32 allocCount = allocOpnd->AsIntConstOpnd()->AsUint32();

            if (slotId >= allocCount)
            {
                Js::Throw::FatalInternalError();
            }
            break;
        }
        case Js::OpCode::ArgIn_A:
            break;
        case Js::OpCode::LdSlot:
        case Js::OpCode::LdSlotArr:
        {
            if (doDynamicCheck && slotId > Js::ScopeSlots::FirstSlotIndex)
            {
                insertSlotArrayCheck = true;
            }
            break;
        }
        case Js::OpCode::SlotArrayCheck:
        {
            uint32 currentSlotId = instrDef->GetSrc2()->AsIntConstOpnd()->AsInt32();
            if (slotId > currentSlotId)
            {
                instrDef->ReplaceSrc2(IR::IntConstOpnd::New(slotId, TyUint32, m_func));
            }
            break;
        }
        default:
            Js::Throw::FatalInternalError();
        }
    }
    if (insertSlotArrayCheck)
    {
        IR::Instr *insertInstr = instrDef->m_next;
        IR::RegOpnd *dstOpnd = instrDef->UnlinkDst()->AsRegOpnd();
        IR::Instr *checkInstr = IR::Instr::New(Js::OpCode::SlotArrayCheck, dstOpnd, m_func);

        dstOpnd = IR::RegOpnd::New(TyVar, m_func);
        instrDef->SetDst(dstOpnd);
        checkInstr->SetSrc1(dstOpnd);

        // Attach the slot ID to the check instruction.
        IR::IntConstOpnd *slotIdOpnd = IR::IntConstOpnd::New(slotId, TyUint32, m_func);
        checkInstr->SetSrc2(slotIdOpnd);
        insertInstr->InsertBefore(checkInstr);
    }
    return instr->m_prev;
}